

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpdatableModelValidatorTests.cpp
# Opt level: O3

int testValid_Classifier_Target(void)

{
  Rep *pRVar1;
  void *pvVar2;
  string *psVar3;
  pointer pcVar4;
  bool bVar5;
  ModelDescription *pMVar6;
  Type *pTVar7;
  LogMessage *other;
  CategoricalCrossEntropyLossLayer *pCVar8;
  FeatureType *this;
  ArrayFeatureType *this_00;
  ostream *poVar9;
  long lVar10;
  int iVar11;
  long *plVar12;
  long lVar13;
  NetworkUpdateParameters *pNVar14;
  void **ppvVar15;
  Model spec;
  string target;
  FeatureDescription feature;
  Result res;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  classLabels;
  TensorAttributes tensorAttributesIn;
  string labels [4];
  LogFinisher local_1c9;
  Model local_1c8;
  string local_198;
  vector<long,_std::allocator<long>_> local_178;
  undefined1 local_158 [8];
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140 [2];
  _func_int **local_120;
  _Alloc_hider local_118;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0;
  TensorAttributes local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  undefined1 *local_98 [2];
  undefined1 local_88 [16];
  undefined1 *local_78 [2];
  undefined1 local_68 [16];
  long *local_58 [2];
  long local_48 [3];
  
  CoreML::Specification::Model::Model(&local_1c8);
  CoreML::Result::Result((Result *)&local_120);
  local_c8.name._0_4_ = 0x2f3795;
  local_c8.name._4_4_ = 0;
  local_c8.dimension = 3;
  local_c8._12_4_ = 0;
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_b8,"1","");
  local_98[0] = local_88;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_98,"2","");
  local_78[0] = local_68;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"3","");
  plVar12 = local_48;
  local_58[0] = plVar12;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_58,"4","");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  vector<std::__cxx11::string*,void>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_e0,
             &local_b8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_48 + 2),
             (allocator_type *)local_158);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_f8,&local_e0);
  local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data._M_start
       = (pointer)0x0;
  local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  buildBasicNeuralNetworkClassifierModel(&local_1c8,true,&local_c8,&local_f8,&local_178,true);
  if (local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_178.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_f8);
  local_1c8.specificationversion_ = 4;
  if (local_1c8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1c8.description_ = pMVar6;
  }
  google::protobuf::internal::RepeatedPtrFieldBase::
  Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
            (&((local_1c8.description_)->traininginput_).super_RepeatedPtrFieldBase);
  pMVar6 = local_1c8.description_;
  if (local_1c8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
  }
  pRVar1 = (pMVar6->input_).super_RepeatedPtrFieldBase.rep_;
  ppvVar15 = pRVar1->elements;
  if (pRVar1 == (Rep *)0x0) {
    ppvVar15 = (void **)0x0;
  }
  lVar13 = (long)(pMVar6->input_).super_RepeatedPtrFieldBase.current_size_;
  if (lVar13 != 0) {
    lVar10 = 0;
    do {
      CoreML::Specification::FeatureDescription::FeatureDescription
                ((FeatureDescription *)local_158,*(FeatureDescription **)((long)ppvVar15 + lVar10));
      if (local_1c8.description_ == (ModelDescription *)0x0) {
        pMVar6 = (ModelDescription *)operator_new(0x78);
        CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
        local_1c8.description_ = pMVar6;
      }
      pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
               Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                         (&((local_1c8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                          (Type *)0x0);
      CoreML::Specification::FeatureDescription::CopyFrom(pTVar7,(FeatureDescription *)local_158);
      CoreML::Specification::FeatureDescription::~FeatureDescription
                ((FeatureDescription *)local_158);
      lVar10 = lVar10 + 8;
    } while (lVar13 * 8 != lVar10);
  }
  if (local_1c8.description_ == (ModelDescription *)0x0) {
    pMVar6 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar6);
    local_1c8.description_ = pMVar6;
  }
  pTVar7 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_1c8.description_)->traininginput_).super_RepeatedPtrFieldBase,
                      (Type *)0x0);
  if (local_1c8._oneof_case_[0] != 0x193) {
    local_1c8.Type_.neuralnetworkclassifier_ =
         CoreML::Specification::NeuralNetworkClassifier::default_instance();
  }
  pNVar14 = (local_1c8.Type_.neuralnetworkclassifier_)->updateparams_;
  if (pNVar14 == (NetworkUpdateParameters *)0x0) {
    pNVar14 = (NetworkUpdateParameters *)
              &CoreML::Specification::_NetworkUpdateParameters_default_instance_;
  }
  if ((pNVar14->losslayers_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_158,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    other = google::protobuf::internal::LogMessage::operator<<
                      ((LogMessage *)local_158,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=(&local_1c9,other);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_158);
  }
  pvVar2 = ((pNVar14->losslayers_).super_RepeatedPtrFieldBase.rep_)->elements[0];
  if (*(int *)((long)pvVar2 + 0x24) == 10) {
    pCVar8 = *(CategoricalCrossEntropyLossLayer **)((long)pvVar2 + 0x18);
  }
  else {
    pCVar8 = CoreML::Specification::CategoricalCrossEntropyLossLayer::default_instance();
  }
  psVar3 = (pCVar8->target_).ptr_;
  pcVar4 = (psVar3->_M_dataplus)._M_p;
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_198,pcVar4,pcVar4 + psVar3->_M_string_length);
  psVar3 = (pTVar7->name_).ptr_;
  if (psVar3 == (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_) {
    google::protobuf::internal::ArenaStringPtr::CreateInstanceNoArena(&pTVar7->name_,&local_198);
  }
  else {
    std::__cxx11::string::_M_assign((string *)psVar3);
  }
  this = pTVar7->type_;
  if (this == (FeatureType *)0x0) {
    this = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(this);
    pTVar7->type_ = this;
  }
  if (this->_oneof_case_[0] == 5) {
    this_00 = (this->Type_).multiarraytype_;
  }
  else {
    CoreML::Specification::FeatureType::clear_Type(this);
    this->_oneof_case_[0] = 5;
    this_00 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(this_00);
    (this->Type_).multiarraytype_ = this_00;
  }
  this_00->datatype_ = 0x20020;
  iVar11 = (this_00->shape_).current_size_;
  if (iVar11 == (this_00->shape_).total_size_) {
    google::protobuf::RepeatedField<long>::Reserve(&this_00->shape_,iVar11 + 1);
    iVar11 = (this_00->shape_).current_size_;
  }
  (this_00->shape_).current_size_ = iVar11 + 1;
  ((this_00->shape_).rep_)->elements[iVar11] = 1;
  CoreML::Model::validate((Result *)local_158,&local_1c8);
  local_120 = (_func_int **)local_158;
  std::__cxx11::string::operator=((string *)&local_118,(string *)&local_150);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_150._M_p != local_140) {
    operator_delete(local_150._M_p,(ulong)(local_140[0]._M_allocated_capacity + 1));
  }
  bVar5 = CoreML::Result::good((Result *)&local_120);
  if (!bVar5) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/UpdatableModelValidatorTests.cpp"
               ,0x78);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar9 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x8f7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"(res).good()",0xc);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p,local_198.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_e0);
  lVar13 = -0x80;
  do {
    if (plVar12 != (long *)plVar12[-2]) {
      operator_delete((long *)plVar12[-2],*plVar12 + 1);
    }
    plVar12 = plVar12 + -4;
    lVar13 = lVar13 + 0x20;
  } while (lVar13 != 0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_p != &local_108) {
    operator_delete(local_118._M_p,local_108._M_allocated_capacity + 1);
  }
  CoreML::Specification::Model::~Model(&local_1c8);
  return (uint)!bVar5;
}

Assistant:

int testValid_Classifier_Target() {
    Specification::Model spec;
    Result res;
    TensorAttributes tensorAttributesIn = { "InTensor", 3 };

    std::string labels[] = { "1", "2", "3", "4" };
    std::vector<std::string> classLabels(labels, labels + sizeof(labels) / sizeof(std::string));

    (void)buildBasicNeuralNetworkClassifierModel(spec, true, &tensorAttributesIn, classLabels, std::vector<int64_t>(), true);
    spec.set_specificationversion(MLMODEL_SPECIFICATION_VERSION_IOS13);

    // Clearing and then specifically adding only the predicted feature name as a training input (for the classifier)
    spec.mutable_description()->clear_traininginput();

    // Re-adding model inputs and the target to classifier's training inputs
    for (auto feature : spec.description().input()) {
        auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
        trainingInput->CopyFrom(feature);
    }

    auto trainingInput = spec.mutable_description()->mutable_traininginput()->Add();
    std::string target = spec.neuralnetworkclassifier().updateparams().losslayers(0).categoricalcrossentropylosslayer().target();
    trainingInput->set_name(target);
    auto trainingInputTensorShape = trainingInput->mutable_type()->mutable_multiarraytype();
    trainingInputTensorShape->set_datatype(Specification::ArrayFeatureType_ArrayDataType_INT32);
    trainingInputTensorShape->add_shape(1);

    res = Model::validate(spec);
    ML_ASSERT_GOOD(res);

    return 0;
}